

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_CoalescedMSFStream.cpp
# Opt level: O2

void __thiscall
PDB::CoalescedMSFStream::CoalescedMSFStream(CoalescedMSFStream *this,CoalescedMSFStream *other)

{
  Byte *pBVar1;
  
  pBVar1 = other->m_data;
  this->m_ownedData = other->m_ownedData;
  this->m_data = pBVar1;
  this->m_size = other->m_size;
  other->m_ownedData = (Byte *)0x0;
  other->m_data = (Byte *)0x0;
  other->m_size = 0;
  return;
}

Assistant:

PDB::CoalescedMSFStream::CoalescedMSFStream(CoalescedMSFStream&& other) PDB_NO_EXCEPT
	: m_ownedData(PDB_MOVE(other.m_ownedData))
	, m_data(PDB_MOVE(other.m_data))
	, m_size(PDB_MOVE(other.m_size))
{
	other.m_ownedData = nullptr;
	other.m_data = nullptr;
	other.m_size = 0u;
}